

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFile.cpp
# Opt level: O0

void __thiscall ObjectFile::discardAttributes(ObjectFile *this)

{
  bool bVar1;
  pointer ppVar2;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_OSAttribute_*>_> *in_RDI;
  iterator i;
  map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
  cleanUp;
  MutexLocker lock;
  Mutex *in_stack_ffffffffffffff78;
  OSAttribute *in_stack_ffffffffffffff80;
  _Self local_68;
  _Self local_60 [12];
  
  MutexLocker::MutexLocker((MutexLocker *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::
  map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
  ::map((map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
         *)in_stack_ffffffffffffff80,
        (map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
         *)in_stack_ffffffffffffff78);
  std::
  map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
  ::clear((map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
           *)0x154bed);
  local_60[0]._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
       ::begin((map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                *)in_stack_ffffffffffffff78);
  while( true ) {
    local_68._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
         ::end((map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                *)in_stack_ffffffffffffff78);
    bVar1 = std::operator!=(local_60,&local_68);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_OSAttribute_*>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_unsigned_long,_OSAttribute_*>_> *)
                        0x154c2a);
    if (ppVar2->second != (OSAttribute *)0x0) {
      ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_OSAttribute_*>_>::operator->
                         ((_Rb_tree_iterator<std::pair<const_unsigned_long,_OSAttribute_*>_> *)
                          0x154c57);
      in_stack_ffffffffffffff80 = ppVar2->second;
      if (in_stack_ffffffffffffff80 != (OSAttribute *)0x0) {
        (*in_stack_ffffffffffffff80->_vptr_OSAttribute[1])();
      }
      ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_OSAttribute_*>_>::operator->
                         ((_Rb_tree_iterator<std::pair<const_unsigned_long,_OSAttribute_*>_> *)
                          0x154c7b);
      ppVar2->second = (OSAttribute *)0x0;
    }
    std::_Rb_tree_iterator<std::pair<const_unsigned_long,_OSAttribute_*>_>::operator++
              (in_RDI,(int)((ulong)in_stack_ffffffffffffff80 >> 0x20));
  }
  std::
  map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
  ::~map((map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
          *)0x154ca3);
  MutexLocker::~MutexLocker((MutexLocker *)in_stack_ffffffffffffff80);
  return;
}

Assistant:

void ObjectFile::discardAttributes()
{
	MutexLocker lock(objectMutex);

	std::map<CK_ATTRIBUTE_TYPE, OSAttribute*> cleanUp = attributes;
	attributes.clear();

	for (std::map<CK_ATTRIBUTE_TYPE, OSAttribute*>::iterator i = cleanUp.begin(); i != cleanUp.end(); i++)
	{
		if (i->second == NULL)
		{
			continue;
		}

		delete i->second;
		i->second = NULL;
	}
}